

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

Vector2i __thiscall sf::priv::WindowImplX11::getPrimaryMonitorPosition(WindowImplX11 *this)

{
  uint uVar1;
  bool bVar2;
  XRRScreenResources *res;
  RROutput RVar3;
  long lVar4;
  ostream *poVar5;
  Vector2i VVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  int xRandRMinor;
  int xRandRMajor;
  Window rootWindow;
  int local_30;
  int local_2c;
  Window local_28;
  
  local_28 = *(Window *)(*(long *)(this->m_display + 0xe8) + 0x10 + (long)this->m_screen * 0x80);
  res = (XRRScreenResources *)XRRGetScreenResources();
  if (res == (XRRScreenResources *)0x0) {
    poVar5 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Failed to get the current screen resources for.primary monitor position",0x47
              );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    VVar6.x = 0;
    VVar6.y = 0;
    return VVar6;
  }
  bVar2 = checkXRandR(this,&local_2c,&local_30);
  if (!bVar2) {
    local_30 = 0;
    local_2c = 0;
  }
  RVar3 = getOutputPrimary(this,&local_28,res,local_2c,local_30);
  lVar4 = XRRGetOutputInfo(this->m_display,res,RVar3);
  if (lVar4 == 0) {
    XRRFreeScreenResources(res);
LAB_0018f7dc:
    poVar5 = err();
    pcVar8 = "Failed to get output info for.primary monitor position";
    lVar4 = 0x36;
  }
  else {
    if (*(short *)(lVar4 + 0x30) == 1) {
      XRRFreeScreenResources(res);
      XRRFreeOutputInfo(lVar4);
      goto LAB_0018f7dc;
    }
    lVar7 = XRRGetCrtcInfo(this->m_display,res,*(undefined8 *)(lVar4 + 8));
    if (lVar7 != 0) {
      uVar9 = (ulong)*(uint *)(lVar7 + 8);
      uVar1 = *(uint *)(lVar7 + 0xc);
      XRRFreeCrtcInfo(lVar7);
      XRRFreeOutputInfo(lVar4);
      XRRFreeScreenResources(res);
      uVar10 = (ulong)uVar1 << 0x20;
      goto LAB_0018f825;
    }
    XRRFreeScreenResources(res);
    XRRFreeOutputInfo(lVar4);
    poVar5 = err();
    pcVar8 = "Failed to get crtc info for.primary monitor position";
    lVar4 = 0x34;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar10 = 0;
  uVar9 = 0;
LAB_0018f825:
  return (Vector2i)(uVar10 | uVar9);
}

Assistant:

Vector2i WindowImplX11::getPrimaryMonitorPosition()
{
    Vector2i monitorPosition;

    // Get root window
    ::Window rootWindow = RootWindow(m_display, m_screen);

    // Get the screen resources
    XRRScreenResources* res = XRRGetScreenResources(m_display, rootWindow);
    if (!res)
    {
        err() << "Failed to get the current screen resources for.primary monitor position" << std::endl;
        return monitorPosition;
    }

    // Get xRandr version
    int xRandRMajor, xRandRMinor;
    if (!checkXRandR(xRandRMajor, xRandRMinor))
        xRandRMajor = xRandRMinor = 0;

    RROutput output = getOutputPrimary(rootWindow, res, xRandRMajor, xRandRMinor);

    // Get output info from output
    XRROutputInfo* outputInfo = XRRGetOutputInfo(m_display, res, output);
    if (!outputInfo || outputInfo->connection == RR_Disconnected)
    {
        XRRFreeScreenResources(res);

        // If outputInfo->connection == RR_Disconnected, free output info
        if (outputInfo)
            XRRFreeOutputInfo(outputInfo);

        err() << "Failed to get output info for.primary monitor position" << std::endl;
        return monitorPosition;
    }

    // Retreive current RRMode, screen position and rotation
    XRRCrtcInfo* crtcInfo = XRRGetCrtcInfo(m_display, res, outputInfo->crtc);
    if (!crtcInfo)
    {
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(outputInfo);
        err() << "Failed to get crtc info for.primary monitor position" << std::endl;
        return monitorPosition;
    }

    monitorPosition.x = crtcInfo->x;
    monitorPosition.y = crtcInfo->y;

    XRRFreeCrtcInfo(crtcInfo);
    XRRFreeOutputInfo(outputInfo);
    XRRFreeScreenResources(res);

    return monitorPosition;
}